

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# monster_test_generated.h
# Opt level: O0

void __thiscall MyGame::Example::MonsterT::MonsterT(MonsterT *this,MonsterT *o)

{
  float fVar1;
  int32_t iVar2;
  int8_t iVar3;
  Test TVar4;
  int16_t iVar5;
  bool bVar6;
  type pVVar7;
  size_type_conflict sVar8;
  type pMVar9;
  type pRVar10;
  type pSVar11;
  StatT *local_390;
  ReferrableT *local_368;
  ReferrableT *local_340;
  ReferrableT *local_318;
  MonsterT *local_2f0;
  pointer local_268;
  pointer local_218;
  pointer local_1f0;
  pointer local_1a0;
  StatT *local_170;
  unique_ptr *local_168;
  unique_ptr<MyGame::Example::StatT,_std::default_delete<MyGame::Example::StatT>_>
  *scalar_key_sorted_tables_;
  const_iterator __end2_4;
  const_iterator __begin2_4;
  vector<std::unique_ptr<MyGame::Example::StatT,_std::default_delete<MyGame::Example::StatT>_>,_std::allocator<std::unique_ptr<MyGame::Example::StatT,_std::default_delete<MyGame::Example::StatT>_>_>_>
  *__range2_4;
  ReferrableT *local_138;
  unique_ptr *local_130;
  unique_ptr<MyGame::Example::ReferrableT,_std::default_delete<MyGame::Example::ReferrableT>_>
  *vector_of_co_owning_references_;
  const_iterator __end2_3;
  const_iterator __begin2_3;
  vector<std::unique_ptr<MyGame::Example::ReferrableT,_std::default_delete<MyGame::Example::ReferrableT>_>,_std::allocator<std::unique_ptr<MyGame::Example::ReferrableT,_std::default_delete<MyGame::Example::ReferrableT>_>_>_>
  *__range2_3;
  ReferrableT *local_100;
  unique_ptr *local_f8;
  unique_ptr<MyGame::Example::ReferrableT,_std::default_delete<MyGame::Example::ReferrableT>_>
  *vector_of_strong_referrables_;
  const_iterator __end2_2;
  const_iterator __begin2_2;
  vector<std::unique_ptr<MyGame::Example::ReferrableT,_std::default_delete<MyGame::Example::ReferrableT>_>,_std::allocator<std::unique_ptr<MyGame::Example::ReferrableT,_std::default_delete<MyGame::Example::ReferrableT>_>_>_>
  *__range2_2;
  ReferrableT *local_c8;
  unique_ptr *local_c0;
  unique_ptr<MyGame::Example::ReferrableT,_std::default_delete<MyGame::Example::ReferrableT>_>
  *vector_of_referrables_;
  const_iterator __end2_1;
  const_iterator __begin2_1;
  vector<std::unique_ptr<MyGame::Example::ReferrableT,_std::default_delete<MyGame::Example::ReferrableT>_>,_std::allocator<std::unique_ptr<MyGame::Example::ReferrableT,_std::default_delete<MyGame::Example::ReferrableT>_>_>_>
  *__range2_1;
  MonsterT *local_90;
  unique_ptr *local_88;
  unique_ptr<MyGame::Example::MonsterT,_std::default_delete<MyGame::Example::MonsterT>_>
  *testarrayoftables_;
  const_iterator __end2;
  const_iterator __begin2;
  vector<std::unique_ptr<MyGame::Example::MonsterT,_std::default_delete<MyGame::Example::MonsterT>_>,_std::allocator<std::unique_ptr<MyGame::Example::MonsterT,_std::default_delete<MyGame::Example::MonsterT>_>_>_>
  *__range2;
  MonsterT *o_local;
  MonsterT *this_local;
  
  bVar6 = std::unique_ptr::operator_cast_to_bool((unique_ptr *)o);
  if (bVar6) {
    local_1a0 = (pointer)operator_new(0x20);
    pVVar7 = std::unique_ptr<MyGame::Example::Vec3,_std::default_delete<MyGame::Example::Vec3>_>::
             operator*(&o->pos);
    fVar1 = pVVar7->y_;
    local_1a0->x_ = pVVar7->x_;
    local_1a0->y_ = fVar1;
    iVar2 = pVVar7->padding0__;
    local_1a0->z_ = pVVar7->z_;
    local_1a0->padding0__ = iVar2;
    local_1a0->test1_ = pVVar7->test1_;
    iVar3 = pVVar7->padding1__;
    TVar4 = pVVar7->test3_;
    iVar5 = pVVar7->padding2__;
    local_1a0->test2_ = pVVar7->test2_;
    local_1a0->padding1__ = iVar3;
    local_1a0->test3_ = TVar4;
    local_1a0->padding2__ = iVar5;
  }
  else {
    local_1a0 = (pointer)0x0;
  }
  std::unique_ptr<MyGame::Example::Vec3,std::default_delete<MyGame::Example::Vec3>>::
  unique_ptr<std::default_delete<MyGame::Example::Vec3>,void>
            ((unique_ptr<MyGame::Example::Vec3,std::default_delete<MyGame::Example::Vec3>> *)this,
             local_1a0);
  this->mana = o->mana;
  this->hp = o->hp;
  std::__cxx11::string::string((string *)&this->name,(string *)&o->name);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector(&this->inventory,&o->inventory)
  ;
  this->color = o->color;
  AnyUnion::AnyUnion(&this->test,&o->test);
  std::vector<MyGame::Example::Test,_std::allocator<MyGame::Example::Test>_>::vector
            (&this->test4,&o->test4);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&this->testarrayofstring,&o->testarrayofstring);
  memset(&this->testarrayoftables,0,0x18);
  std::
  vector<std::unique_ptr<MyGame::Example::MonsterT,_std::default_delete<MyGame::Example::MonsterT>_>,_std::allocator<std::unique_ptr<MyGame::Example::MonsterT,_std::default_delete<MyGame::Example::MonsterT>_>_>_>
  ::vector(&this->testarrayoftables);
  bVar6 = std::unique_ptr::operator_cast_to_bool((unique_ptr *)&o->enemy);
  if (bVar6) {
    local_1f0 = (pointer)operator_new(800);
    pMVar9 = std::
             unique_ptr<MyGame::Example::MonsterT,_std::default_delete<MyGame::Example::MonsterT>_>
             ::operator*(&o->enemy);
    MonsterT(local_1f0,pMVar9);
  }
  else {
    local_1f0 = (pointer)0x0;
  }
  std::unique_ptr<MyGame::Example::MonsterT,std::default_delete<MyGame::Example::MonsterT>>::
  unique_ptr<std::default_delete<MyGame::Example::MonsterT>,void>
            ((unique_ptr<MyGame::Example::MonsterT,std::default_delete<MyGame::Example::MonsterT>> *
             )&this->enemy,local_1f0);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            (&this->testnestedflatbuffer,&o->testnestedflatbuffer);
  bVar6 = std::unique_ptr::operator_cast_to_bool((unique_ptr *)&o->testempty);
  if (bVar6) {
    local_218 = (pointer)operator_new(0x30);
    pSVar11 = std::unique_ptr<MyGame::Example::StatT,_std::default_delete<MyGame::Example::StatT>_>
              ::operator*(&o->testempty);
    StatT::StatT(local_218,pSVar11);
  }
  else {
    local_218 = (pointer)0x0;
  }
  std::unique_ptr<MyGame::Example::StatT,std::default_delete<MyGame::Example::StatT>>::
  unique_ptr<std::default_delete<MyGame::Example::StatT>,void>
            ((unique_ptr<MyGame::Example::StatT,std::default_delete<MyGame::Example::StatT>> *)
             &this->testempty,local_218);
  this->testbool = (bool)(o->testbool & 1);
  this->testhashs32_fnv1 = o->testhashs32_fnv1;
  this->testhashu32_fnv1 = o->testhashu32_fnv1;
  this->testhashs64_fnv1 = o->testhashs64_fnv1;
  this->testhashu64_fnv1 = o->testhashu64_fnv1;
  this->testhashs32_fnv1a = o->testhashs32_fnv1a;
  this->testhashu32_fnv1a = o->testhashu32_fnv1a;
  this->testhashs64_fnv1a = o->testhashs64_fnv1a;
  this->testhashu64_fnv1a = o->testhashu64_fnv1a;
  std::vector<bool,_std::allocator<bool>_>::vector(&this->testarrayofbools,&o->testarrayofbools);
  this->testf = o->testf;
  this->testf2 = o->testf2;
  this->testf3 = o->testf3;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&this->testarrayofstring2,&o->testarrayofstring2);
  std::vector<MyGame::Example::Ability,_std::allocator<MyGame::Example::Ability>_>::vector
            (&this->testarrayofsortedstruct,&o->testarrayofsortedstruct);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector(&this->flex,&o->flex);
  std::vector<MyGame::Example::Test,_std::allocator<MyGame::Example::Test>_>::vector
            (&this->test5,&o->test5);
  std::vector<long,_std::allocator<long>_>::vector(&this->vector_of_longs,&o->vector_of_longs);
  std::vector<double,_std::allocator<double>_>::vector
            (&this->vector_of_doubles,&o->vector_of_doubles);
  bVar6 = std::unique_ptr::operator_cast_to_bool((unique_ptr *)&o->parent_namespace_test);
  if (bVar6) {
    local_268 = (pointer)operator_new(1);
    std::unique_ptr<MyGame::InParentNamespaceT,_std::default_delete<MyGame::InParentNamespaceT>_>::
    operator*(&o->parent_namespace_test);
  }
  else {
    local_268 = (pointer)0x0;
  }
  std::unique_ptr<MyGame::InParentNamespaceT,std::default_delete<MyGame::InParentNamespaceT>>::
  unique_ptr<std::default_delete<MyGame::InParentNamespaceT>,void>
            ((unique_ptr<MyGame::InParentNamespaceT,std::default_delete<MyGame::InParentNamespaceT>>
              *)&this->parent_namespace_test,local_268);
  (this->vector_of_referrables).
  super__Vector_base<std::unique_ptr<MyGame::Example::ReferrableT,_std::default_delete<MyGame::Example::ReferrableT>_>,_std::allocator<std::unique_ptr<MyGame::Example::ReferrableT,_std::default_delete<MyGame::Example::ReferrableT>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->vector_of_referrables).
  super__Vector_base<std::unique_ptr<MyGame::Example::ReferrableT,_std::default_delete<MyGame::Example::ReferrableT>_>,_std::allocator<std::unique_ptr<MyGame::Example::ReferrableT,_std::default_delete<MyGame::Example::ReferrableT>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->vector_of_referrables).
  super__Vector_base<std::unique_ptr<MyGame::Example::ReferrableT,_std::default_delete<MyGame::Example::ReferrableT>_>,_std::allocator<std::unique_ptr<MyGame::Example::ReferrableT,_std::default_delete<MyGame::Example::ReferrableT>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::
  vector<std::unique_ptr<MyGame::Example::ReferrableT,_std::default_delete<MyGame::Example::ReferrableT>_>,_std::allocator<std::unique_ptr<MyGame::Example::ReferrableT,_std::default_delete<MyGame::Example::ReferrableT>_>_>_>
  ::vector(&this->vector_of_referrables);
  this->single_weak_reference = o->single_weak_reference;
  std::vector<MyGame::Example::ReferrableT_*,_std::allocator<MyGame::Example::ReferrableT_*>_>::
  vector(&this->vector_of_weak_references,&o->vector_of_weak_references);
  (this->vector_of_strong_referrables).
  super__Vector_base<std::unique_ptr<MyGame::Example::ReferrableT,_std::default_delete<MyGame::Example::ReferrableT>_>,_std::allocator<std::unique_ptr<MyGame::Example::ReferrableT,_std::default_delete<MyGame::Example::ReferrableT>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->vector_of_strong_referrables).
  super__Vector_base<std::unique_ptr<MyGame::Example::ReferrableT,_std::default_delete<MyGame::Example::ReferrableT>_>,_std::allocator<std::unique_ptr<MyGame::Example::ReferrableT,_std::default_delete<MyGame::Example::ReferrableT>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->vector_of_strong_referrables).
  super__Vector_base<std::unique_ptr<MyGame::Example::ReferrableT,_std::default_delete<MyGame::Example::ReferrableT>_>,_std::allocator<std::unique_ptr<MyGame::Example::ReferrableT,_std::default_delete<MyGame::Example::ReferrableT>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::
  vector<std::unique_ptr<MyGame::Example::ReferrableT,_std::default_delete<MyGame::Example::ReferrableT>_>,_std::allocator<std::unique_ptr<MyGame::Example::ReferrableT,_std::default_delete<MyGame::Example::ReferrableT>_>_>_>
  ::vector(&this->vector_of_strong_referrables);
  this->co_owning_reference = o->co_owning_reference;
  (this->vector_of_co_owning_references).
  super__Vector_base<std::unique_ptr<MyGame::Example::ReferrableT,_std::default_delete<MyGame::Example::ReferrableT>_>,_std::allocator<std::unique_ptr<MyGame::Example::ReferrableT,_std::default_delete<MyGame::Example::ReferrableT>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->vector_of_co_owning_references).
  super__Vector_base<std::unique_ptr<MyGame::Example::ReferrableT,_std::default_delete<MyGame::Example::ReferrableT>_>,_std::allocator<std::unique_ptr<MyGame::Example::ReferrableT,_std::default_delete<MyGame::Example::ReferrableT>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->vector_of_co_owning_references).
  super__Vector_base<std::unique_ptr<MyGame::Example::ReferrableT,_std::default_delete<MyGame::Example::ReferrableT>_>,_std::allocator<std::unique_ptr<MyGame::Example::ReferrableT,_std::default_delete<MyGame::Example::ReferrableT>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::
  vector<std::unique_ptr<MyGame::Example::ReferrableT,_std::default_delete<MyGame::Example::ReferrableT>_>,_std::allocator<std::unique_ptr<MyGame::Example::ReferrableT,_std::default_delete<MyGame::Example::ReferrableT>_>_>_>
  ::vector(&this->vector_of_co_owning_references);
  this->non_owning_reference = o->non_owning_reference;
  std::vector<MyGame::Example::ReferrableT_*,_std::allocator<MyGame::Example::ReferrableT_*>_>::
  vector(&this->vector_of_non_owning_references,&o->vector_of_non_owning_references);
  AnyUniqueAliasesUnion::AnyUniqueAliasesUnion(&this->any_unique,&o->any_unique);
  AnyAmbiguousAliasesUnion::AnyAmbiguousAliasesUnion(&this->any_ambiguous,&o->any_ambiguous);
  std::vector<MyGame::Example::Color,_std::allocator<MyGame::Example::Color>_>::vector
            (&this->vector_of_enums,&o->vector_of_enums);
  this->signed_enum = o->signed_enum;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            (&this->testrequirednestedflatbuffer,&o->testrequirednestedflatbuffer);
  (this->scalar_key_sorted_tables).
  super__Vector_base<std::unique_ptr<MyGame::Example::StatT,_std::default_delete<MyGame::Example::StatT>_>,_std::allocator<std::unique_ptr<MyGame::Example::StatT,_std::default_delete<MyGame::Example::StatT>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->scalar_key_sorted_tables).
  super__Vector_base<std::unique_ptr<MyGame::Example::StatT,_std::default_delete<MyGame::Example::StatT>_>,_std::allocator<std::unique_ptr<MyGame::Example::StatT,_std::default_delete<MyGame::Example::StatT>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->scalar_key_sorted_tables).
  super__Vector_base<std::unique_ptr<MyGame::Example::StatT,_std::default_delete<MyGame::Example::StatT>_>,_std::allocator<std::unique_ptr<MyGame::Example::StatT,_std::default_delete<MyGame::Example::StatT>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::
  vector<std::unique_ptr<MyGame::Example::StatT,_std::default_delete<MyGame::Example::StatT>_>,_std::allocator<std::unique_ptr<MyGame::Example::StatT,_std::default_delete<MyGame::Example::StatT>_>_>_>
  ::vector(&this->scalar_key_sorted_tables);
  this->native_inline = o->native_inline;
  this->long_enum_non_enum_default = o->long_enum_non_enum_default;
  this->long_enum_normal_default = o->long_enum_normal_default;
  this->nan_default = o->nan_default;
  this->inf_default = o->inf_default;
  this->positive_inf_default = o->positive_inf_default;
  this->infinity_default = o->infinity_default;
  this->positive_infinity_default = o->positive_infinity_default;
  this->negative_inf_default = o->negative_inf_default;
  this->negative_infinity_default = o->negative_infinity_default;
  this->double_inf_default = o->double_inf_default;
  sVar8 = std::
          vector<std::unique_ptr<MyGame::Example::MonsterT,_std::default_delete<MyGame::Example::MonsterT>_>,_std::allocator<std::unique_ptr<MyGame::Example::MonsterT,_std::default_delete<MyGame::Example::MonsterT>_>_>_>
          ::size(&o->testarrayoftables);
  std::
  vector<std::unique_ptr<MyGame::Example::MonsterT,_std::default_delete<MyGame::Example::MonsterT>_>,_std::allocator<std::unique_ptr<MyGame::Example::MonsterT,_std::default_delete<MyGame::Example::MonsterT>_>_>_>
  ::reserve(&this->testarrayoftables,sVar8);
  __end2 = std::
           vector<std::unique_ptr<MyGame::Example::MonsterT,_std::default_delete<MyGame::Example::MonsterT>_>,_std::allocator<std::unique_ptr<MyGame::Example::MonsterT,_std::default_delete<MyGame::Example::MonsterT>_>_>_>
           ::begin(&o->testarrayoftables);
  testarrayoftables_ =
       (unique_ptr<MyGame::Example::MonsterT,_std::default_delete<MyGame::Example::MonsterT>_> *)
       std::
       vector<std::unique_ptr<MyGame::Example::MonsterT,_std::default_delete<MyGame::Example::MonsterT>_>,_std::allocator<std::unique_ptr<MyGame::Example::MonsterT,_std::default_delete<MyGame::Example::MonsterT>_>_>_>
       ::end(&o->testarrayoftables);
  while( true ) {
    bVar6 = __gnu_cxx::operator!=
                      (&__end2,(__normal_iterator<const_std::unique_ptr<MyGame::Example::MonsterT,_std::default_delete<MyGame::Example::MonsterT>_>_*,_std::vector<std::unique_ptr<MyGame::Example::MonsterT,_std::default_delete<MyGame::Example::MonsterT>_>,_std::allocator<std::unique_ptr<MyGame::Example::MonsterT,_std::default_delete<MyGame::Example::MonsterT>_>_>_>_>
                                *)&testarrayoftables_);
    if (!bVar6) break;
    local_88 = (unique_ptr *)
               __gnu_cxx::
               __normal_iterator<const_std::unique_ptr<MyGame::Example::MonsterT,_std::default_delete<MyGame::Example::MonsterT>_>_*,_std::vector<std::unique_ptr<MyGame::Example::MonsterT,_std::default_delete<MyGame::Example::MonsterT>_>,_std::allocator<std::unique_ptr<MyGame::Example::MonsterT,_std::default_delete<MyGame::Example::MonsterT>_>_>_>_>
               ::operator*(&__end2);
    bVar6 = std::unique_ptr::operator_cast_to_bool(local_88);
    if (bVar6) {
      local_2f0 = (MonsterT *)operator_new(800);
      pMVar9 = std::
               unique_ptr<MyGame::Example::MonsterT,_std::default_delete<MyGame::Example::MonsterT>_>
               ::operator*((unique_ptr<MyGame::Example::MonsterT,_std::default_delete<MyGame::Example::MonsterT>_>
                            *)local_88);
      MonsterT(local_2f0,pMVar9);
    }
    else {
      local_2f0 = (MonsterT *)0x0;
    }
    local_90 = local_2f0;
    std::
    vector<std::unique_ptr<MyGame::Example::MonsterT,std::default_delete<MyGame::Example::MonsterT>>,std::allocator<std::unique_ptr<MyGame::Example::MonsterT,std::default_delete<MyGame::Example::MonsterT>>>>
    ::emplace_back<MyGame::Example::MonsterT*>
              ((vector<std::unique_ptr<MyGame::Example::MonsterT,std::default_delete<MyGame::Example::MonsterT>>,std::allocator<std::unique_ptr<MyGame::Example::MonsterT,std::default_delete<MyGame::Example::MonsterT>>>>
                *)&this->testarrayoftables,&local_90);
    __gnu_cxx::
    __normal_iterator<const_std::unique_ptr<MyGame::Example::MonsterT,_std::default_delete<MyGame::Example::MonsterT>_>_*,_std::vector<std::unique_ptr<MyGame::Example::MonsterT,_std::default_delete<MyGame::Example::MonsterT>_>,_std::allocator<std::unique_ptr<MyGame::Example::MonsterT,_std::default_delete<MyGame::Example::MonsterT>_>_>_>_>
    ::operator++(&__end2);
  }
  sVar8 = std::
          vector<std::unique_ptr<MyGame::Example::ReferrableT,_std::default_delete<MyGame::Example::ReferrableT>_>,_std::allocator<std::unique_ptr<MyGame::Example::ReferrableT,_std::default_delete<MyGame::Example::ReferrableT>_>_>_>
          ::size(&o->vector_of_referrables);
  std::
  vector<std::unique_ptr<MyGame::Example::ReferrableT,_std::default_delete<MyGame::Example::ReferrableT>_>,_std::allocator<std::unique_ptr<MyGame::Example::ReferrableT,_std::default_delete<MyGame::Example::ReferrableT>_>_>_>
  ::reserve(&this->vector_of_referrables,sVar8);
  __end2_1 = std::
             vector<std::unique_ptr<MyGame::Example::ReferrableT,_std::default_delete<MyGame::Example::ReferrableT>_>,_std::allocator<std::unique_ptr<MyGame::Example::ReferrableT,_std::default_delete<MyGame::Example::ReferrableT>_>_>_>
             ::begin(&o->vector_of_referrables);
  vector_of_referrables_ =
       (unique_ptr<MyGame::Example::ReferrableT,_std::default_delete<MyGame::Example::ReferrableT>_>
        *)std::
          vector<std::unique_ptr<MyGame::Example::ReferrableT,_std::default_delete<MyGame::Example::ReferrableT>_>,_std::allocator<std::unique_ptr<MyGame::Example::ReferrableT,_std::default_delete<MyGame::Example::ReferrableT>_>_>_>
          ::end(&o->vector_of_referrables);
  while( true ) {
    bVar6 = __gnu_cxx::operator!=
                      (&__end2_1,
                       (__normal_iterator<const_std::unique_ptr<MyGame::Example::ReferrableT,_std::default_delete<MyGame::Example::ReferrableT>_>_*,_std::vector<std::unique_ptr<MyGame::Example::ReferrableT,_std::default_delete<MyGame::Example::ReferrableT>_>,_std::allocator<std::unique_ptr<MyGame::Example::ReferrableT,_std::default_delete<MyGame::Example::ReferrableT>_>_>_>_>
                        *)&vector_of_referrables_);
    if (!bVar6) break;
    local_c0 = (unique_ptr *)
               __gnu_cxx::
               __normal_iterator<const_std::unique_ptr<MyGame::Example::ReferrableT,_std::default_delete<MyGame::Example::ReferrableT>_>_*,_std::vector<std::unique_ptr<MyGame::Example::ReferrableT,_std::default_delete<MyGame::Example::ReferrableT>_>,_std::allocator<std::unique_ptr<MyGame::Example::ReferrableT,_std::default_delete<MyGame::Example::ReferrableT>_>_>_>_>
               ::operator*(&__end2_1);
    bVar6 = std::unique_ptr::operator_cast_to_bool(local_c0);
    if (bVar6) {
      local_318 = (ReferrableT *)operator_new(8);
      pRVar10 = std::
                unique_ptr<MyGame::Example::ReferrableT,_std::default_delete<MyGame::Example::ReferrableT>_>
                ::operator*((unique_ptr<MyGame::Example::ReferrableT,_std::default_delete<MyGame::Example::ReferrableT>_>
                             *)local_c0);
      local_318->id = pRVar10->id;
    }
    else {
      local_318 = (ReferrableT *)0x0;
    }
    local_c8 = local_318;
    std::
    vector<std::unique_ptr<MyGame::Example::ReferrableT,std::default_delete<MyGame::Example::ReferrableT>>,std::allocator<std::unique_ptr<MyGame::Example::ReferrableT,std::default_delete<MyGame::Example::ReferrableT>>>>
    ::emplace_back<MyGame::Example::ReferrableT*>
              ((vector<std::unique_ptr<MyGame::Example::ReferrableT,std::default_delete<MyGame::Example::ReferrableT>>,std::allocator<std::unique_ptr<MyGame::Example::ReferrableT,std::default_delete<MyGame::Example::ReferrableT>>>>
                *)&this->vector_of_referrables,&local_c8);
    __gnu_cxx::
    __normal_iterator<const_std::unique_ptr<MyGame::Example::ReferrableT,_std::default_delete<MyGame::Example::ReferrableT>_>_*,_std::vector<std::unique_ptr<MyGame::Example::ReferrableT,_std::default_delete<MyGame::Example::ReferrableT>_>,_std::allocator<std::unique_ptr<MyGame::Example::ReferrableT,_std::default_delete<MyGame::Example::ReferrableT>_>_>_>_>
    ::operator++(&__end2_1);
  }
  sVar8 = std::
          vector<std::unique_ptr<MyGame::Example::ReferrableT,_std::default_delete<MyGame::Example::ReferrableT>_>,_std::allocator<std::unique_ptr<MyGame::Example::ReferrableT,_std::default_delete<MyGame::Example::ReferrableT>_>_>_>
          ::size(&o->vector_of_strong_referrables);
  std::
  vector<std::unique_ptr<MyGame::Example::ReferrableT,_std::default_delete<MyGame::Example::ReferrableT>_>,_std::allocator<std::unique_ptr<MyGame::Example::ReferrableT,_std::default_delete<MyGame::Example::ReferrableT>_>_>_>
  ::reserve(&this->vector_of_strong_referrables,sVar8);
  __end2_2 = std::
             vector<std::unique_ptr<MyGame::Example::ReferrableT,_std::default_delete<MyGame::Example::ReferrableT>_>,_std::allocator<std::unique_ptr<MyGame::Example::ReferrableT,_std::default_delete<MyGame::Example::ReferrableT>_>_>_>
             ::begin(&o->vector_of_strong_referrables);
  vector_of_strong_referrables_ =
       (unique_ptr<MyGame::Example::ReferrableT,_std::default_delete<MyGame::Example::ReferrableT>_>
        *)std::
          vector<std::unique_ptr<MyGame::Example::ReferrableT,_std::default_delete<MyGame::Example::ReferrableT>_>,_std::allocator<std::unique_ptr<MyGame::Example::ReferrableT,_std::default_delete<MyGame::Example::ReferrableT>_>_>_>
          ::end(&o->vector_of_strong_referrables);
  while( true ) {
    bVar6 = __gnu_cxx::operator!=
                      (&__end2_2,
                       (__normal_iterator<const_std::unique_ptr<MyGame::Example::ReferrableT,_std::default_delete<MyGame::Example::ReferrableT>_>_*,_std::vector<std::unique_ptr<MyGame::Example::ReferrableT,_std::default_delete<MyGame::Example::ReferrableT>_>,_std::allocator<std::unique_ptr<MyGame::Example::ReferrableT,_std::default_delete<MyGame::Example::ReferrableT>_>_>_>_>
                        *)&vector_of_strong_referrables_);
    if (!bVar6) break;
    local_f8 = (unique_ptr *)
               __gnu_cxx::
               __normal_iterator<const_std::unique_ptr<MyGame::Example::ReferrableT,_std::default_delete<MyGame::Example::ReferrableT>_>_*,_std::vector<std::unique_ptr<MyGame::Example::ReferrableT,_std::default_delete<MyGame::Example::ReferrableT>_>,_std::allocator<std::unique_ptr<MyGame::Example::ReferrableT,_std::default_delete<MyGame::Example::ReferrableT>_>_>_>_>
               ::operator*(&__end2_2);
    bVar6 = std::unique_ptr::operator_cast_to_bool(local_f8);
    if (bVar6) {
      local_340 = (ReferrableT *)operator_new(8);
      pRVar10 = std::
                unique_ptr<MyGame::Example::ReferrableT,_std::default_delete<MyGame::Example::ReferrableT>_>
                ::operator*((unique_ptr<MyGame::Example::ReferrableT,_std::default_delete<MyGame::Example::ReferrableT>_>
                             *)local_f8);
      local_340->id = pRVar10->id;
    }
    else {
      local_340 = (ReferrableT *)0x0;
    }
    local_100 = local_340;
    std::
    vector<std::unique_ptr<MyGame::Example::ReferrableT,std::default_delete<MyGame::Example::ReferrableT>>,std::allocator<std::unique_ptr<MyGame::Example::ReferrableT,std::default_delete<MyGame::Example::ReferrableT>>>>
    ::emplace_back<MyGame::Example::ReferrableT*>
              ((vector<std::unique_ptr<MyGame::Example::ReferrableT,std::default_delete<MyGame::Example::ReferrableT>>,std::allocator<std::unique_ptr<MyGame::Example::ReferrableT,std::default_delete<MyGame::Example::ReferrableT>>>>
                *)&this->vector_of_strong_referrables,&local_100);
    __gnu_cxx::
    __normal_iterator<const_std::unique_ptr<MyGame::Example::ReferrableT,_std::default_delete<MyGame::Example::ReferrableT>_>_*,_std::vector<std::unique_ptr<MyGame::Example::ReferrableT,_std::default_delete<MyGame::Example::ReferrableT>_>,_std::allocator<std::unique_ptr<MyGame::Example::ReferrableT,_std::default_delete<MyGame::Example::ReferrableT>_>_>_>_>
    ::operator++(&__end2_2);
  }
  sVar8 = std::
          vector<std::unique_ptr<MyGame::Example::ReferrableT,_std::default_delete<MyGame::Example::ReferrableT>_>,_std::allocator<std::unique_ptr<MyGame::Example::ReferrableT,_std::default_delete<MyGame::Example::ReferrableT>_>_>_>
          ::size(&o->vector_of_co_owning_references);
  std::
  vector<std::unique_ptr<MyGame::Example::ReferrableT,_std::default_delete<MyGame::Example::ReferrableT>_>,_std::allocator<std::unique_ptr<MyGame::Example::ReferrableT,_std::default_delete<MyGame::Example::ReferrableT>_>_>_>
  ::reserve(&this->vector_of_co_owning_references,sVar8);
  __end2_3 = std::
             vector<std::unique_ptr<MyGame::Example::ReferrableT,_std::default_delete<MyGame::Example::ReferrableT>_>,_std::allocator<std::unique_ptr<MyGame::Example::ReferrableT,_std::default_delete<MyGame::Example::ReferrableT>_>_>_>
             ::begin(&o->vector_of_co_owning_references);
  vector_of_co_owning_references_ =
       (unique_ptr<MyGame::Example::ReferrableT,_std::default_delete<MyGame::Example::ReferrableT>_>
        *)std::
          vector<std::unique_ptr<MyGame::Example::ReferrableT,_std::default_delete<MyGame::Example::ReferrableT>_>,_std::allocator<std::unique_ptr<MyGame::Example::ReferrableT,_std::default_delete<MyGame::Example::ReferrableT>_>_>_>
          ::end(&o->vector_of_co_owning_references);
  while( true ) {
    bVar6 = __gnu_cxx::operator!=
                      (&__end2_3,
                       (__normal_iterator<const_std::unique_ptr<MyGame::Example::ReferrableT,_std::default_delete<MyGame::Example::ReferrableT>_>_*,_std::vector<std::unique_ptr<MyGame::Example::ReferrableT,_std::default_delete<MyGame::Example::ReferrableT>_>,_std::allocator<std::unique_ptr<MyGame::Example::ReferrableT,_std::default_delete<MyGame::Example::ReferrableT>_>_>_>_>
                        *)&vector_of_co_owning_references_);
    if (!bVar6) break;
    local_130 = (unique_ptr *)
                __gnu_cxx::
                __normal_iterator<const_std::unique_ptr<MyGame::Example::ReferrableT,_std::default_delete<MyGame::Example::ReferrableT>_>_*,_std::vector<std::unique_ptr<MyGame::Example::ReferrableT,_std::default_delete<MyGame::Example::ReferrableT>_>,_std::allocator<std::unique_ptr<MyGame::Example::ReferrableT,_std::default_delete<MyGame::Example::ReferrableT>_>_>_>_>
                ::operator*(&__end2_3);
    bVar6 = std::unique_ptr::operator_cast_to_bool(local_130);
    if (bVar6) {
      local_368 = (ReferrableT *)operator_new(8);
      pRVar10 = std::
                unique_ptr<MyGame::Example::ReferrableT,_std::default_delete<MyGame::Example::ReferrableT>_>
                ::operator*((unique_ptr<MyGame::Example::ReferrableT,_std::default_delete<MyGame::Example::ReferrableT>_>
                             *)local_130);
      local_368->id = pRVar10->id;
    }
    else {
      local_368 = (ReferrableT *)0x0;
    }
    local_138 = local_368;
    std::
    vector<std::unique_ptr<MyGame::Example::ReferrableT,std::default_delete<MyGame::Example::ReferrableT>>,std::allocator<std::unique_ptr<MyGame::Example::ReferrableT,std::default_delete<MyGame::Example::ReferrableT>>>>
    ::emplace_back<MyGame::Example::ReferrableT*>
              ((vector<std::unique_ptr<MyGame::Example::ReferrableT,std::default_delete<MyGame::Example::ReferrableT>>,std::allocator<std::unique_ptr<MyGame::Example::ReferrableT,std::default_delete<MyGame::Example::ReferrableT>>>>
                *)&this->vector_of_co_owning_references,&local_138);
    __gnu_cxx::
    __normal_iterator<const_std::unique_ptr<MyGame::Example::ReferrableT,_std::default_delete<MyGame::Example::ReferrableT>_>_*,_std::vector<std::unique_ptr<MyGame::Example::ReferrableT,_std::default_delete<MyGame::Example::ReferrableT>_>,_std::allocator<std::unique_ptr<MyGame::Example::ReferrableT,_std::default_delete<MyGame::Example::ReferrableT>_>_>_>_>
    ::operator++(&__end2_3);
  }
  sVar8 = std::
          vector<std::unique_ptr<MyGame::Example::StatT,_std::default_delete<MyGame::Example::StatT>_>,_std::allocator<std::unique_ptr<MyGame::Example::StatT,_std::default_delete<MyGame::Example::StatT>_>_>_>
          ::size(&o->scalar_key_sorted_tables);
  std::
  vector<std::unique_ptr<MyGame::Example::StatT,_std::default_delete<MyGame::Example::StatT>_>,_std::allocator<std::unique_ptr<MyGame::Example::StatT,_std::default_delete<MyGame::Example::StatT>_>_>_>
  ::reserve(&this->scalar_key_sorted_tables,sVar8);
  __end2_4 = std::
             vector<std::unique_ptr<MyGame::Example::StatT,_std::default_delete<MyGame::Example::StatT>_>,_std::allocator<std::unique_ptr<MyGame::Example::StatT,_std::default_delete<MyGame::Example::StatT>_>_>_>
             ::begin(&o->scalar_key_sorted_tables);
  scalar_key_sorted_tables_ =
       (unique_ptr<MyGame::Example::StatT,_std::default_delete<MyGame::Example::StatT>_> *)
       std::
       vector<std::unique_ptr<MyGame::Example::StatT,_std::default_delete<MyGame::Example::StatT>_>,_std::allocator<std::unique_ptr<MyGame::Example::StatT,_std::default_delete<MyGame::Example::StatT>_>_>_>
       ::end(&o->scalar_key_sorted_tables);
  while( true ) {
    bVar6 = __gnu_cxx::operator!=
                      (&__end2_4,
                       (__normal_iterator<const_std::unique_ptr<MyGame::Example::StatT,_std::default_delete<MyGame::Example::StatT>_>_*,_std::vector<std::unique_ptr<MyGame::Example::StatT,_std::default_delete<MyGame::Example::StatT>_>,_std::allocator<std::unique_ptr<MyGame::Example::StatT,_std::default_delete<MyGame::Example::StatT>_>_>_>_>
                        *)&scalar_key_sorted_tables_);
    if (!bVar6) break;
    local_168 = (unique_ptr *)
                __gnu_cxx::
                __normal_iterator<const_std::unique_ptr<MyGame::Example::StatT,_std::default_delete<MyGame::Example::StatT>_>_*,_std::vector<std::unique_ptr<MyGame::Example::StatT,_std::default_delete<MyGame::Example::StatT>_>,_std::allocator<std::unique_ptr<MyGame::Example::StatT,_std::default_delete<MyGame::Example::StatT>_>_>_>_>
                ::operator*(&__end2_4);
    bVar6 = std::unique_ptr::operator_cast_to_bool(local_168);
    if (bVar6) {
      local_390 = (StatT *)operator_new(0x30);
      pSVar11 = std::
                unique_ptr<MyGame::Example::StatT,_std::default_delete<MyGame::Example::StatT>_>::
                operator*((unique_ptr<MyGame::Example::StatT,_std::default_delete<MyGame::Example::StatT>_>
                           *)local_168);
      StatT::StatT(local_390,pSVar11);
    }
    else {
      local_390 = (StatT *)0x0;
    }
    local_170 = local_390;
    std::
    vector<std::unique_ptr<MyGame::Example::StatT,std::default_delete<MyGame::Example::StatT>>,std::allocator<std::unique_ptr<MyGame::Example::StatT,std::default_delete<MyGame::Example::StatT>>>>
    ::emplace_back<MyGame::Example::StatT*>
              ((vector<std::unique_ptr<MyGame::Example::StatT,std::default_delete<MyGame::Example::StatT>>,std::allocator<std::unique_ptr<MyGame::Example::StatT,std::default_delete<MyGame::Example::StatT>>>>
                *)&this->scalar_key_sorted_tables,&local_170);
    __gnu_cxx::
    __normal_iterator<const_std::unique_ptr<MyGame::Example::StatT,_std::default_delete<MyGame::Example::StatT>_>_*,_std::vector<std::unique_ptr<MyGame::Example::StatT,_std::default_delete<MyGame::Example::StatT>_>,_std::allocator<std::unique_ptr<MyGame::Example::StatT,_std::default_delete<MyGame::Example::StatT>_>_>_>_>
    ::operator++(&__end2_4);
  }
  return;
}

Assistant:

inline MonsterT::MonsterT(const MonsterT &o)
      : pos((o.pos) ? new MyGame::Example::Vec3(*o.pos) : nullptr),
        mana(o.mana),
        hp(o.hp),
        name(o.name),
        inventory(o.inventory),
        color(o.color),
        test(o.test),
        test4(o.test4),
        testarrayofstring(o.testarrayofstring),
        enemy((o.enemy) ? new MyGame::Example::MonsterT(*o.enemy) : nullptr),
        testnestedflatbuffer(o.testnestedflatbuffer),
        testempty((o.testempty) ? new MyGame::Example::StatT(*o.testempty) : nullptr),
        testbool(o.testbool),
        testhashs32_fnv1(o.testhashs32_fnv1),
        testhashu32_fnv1(o.testhashu32_fnv1),
        testhashs64_fnv1(o.testhashs64_fnv1),
        testhashu64_fnv1(o.testhashu64_fnv1),
        testhashs32_fnv1a(o.testhashs32_fnv1a),
        testhashu32_fnv1a(o.testhashu32_fnv1a),
        testhashs64_fnv1a(o.testhashs64_fnv1a),
        testhashu64_fnv1a(o.testhashu64_fnv1a),
        testarrayofbools(o.testarrayofbools),
        testf(o.testf),
        testf2(o.testf2),
        testf3(o.testf3),
        testarrayofstring2(o.testarrayofstring2),
        testarrayofsortedstruct(o.testarrayofsortedstruct),
        flex(o.flex),
        test5(o.test5),
        vector_of_longs(o.vector_of_longs),
        vector_of_doubles(o.vector_of_doubles),
        parent_namespace_test((o.parent_namespace_test) ? new MyGame::InParentNamespaceT(*o.parent_namespace_test) : nullptr),
        single_weak_reference(o.single_weak_reference),
        vector_of_weak_references(o.vector_of_weak_references),
        co_owning_reference(o.co_owning_reference),
        non_owning_reference(o.non_owning_reference),
        vector_of_non_owning_references(o.vector_of_non_owning_references),
        any_unique(o.any_unique),
        any_ambiguous(o.any_ambiguous),
        vector_of_enums(o.vector_of_enums),
        signed_enum(o.signed_enum),
        testrequirednestedflatbuffer(o.testrequirednestedflatbuffer),
        native_inline(o.native_inline),
        long_enum_non_enum_default(o.long_enum_non_enum_default),
        long_enum_normal_default(o.long_enum_normal_default),
        nan_default(o.nan_default),
        inf_default(o.inf_default),
        positive_inf_default(o.positive_inf_default),
        infinity_default(o.infinity_default),
        positive_infinity_default(o.positive_infinity_default),
        negative_inf_default(o.negative_inf_default),
        negative_infinity_default(o.negative_infinity_default),
        double_inf_default(o.double_inf_default) {
  testarrayoftables.reserve(o.testarrayoftables.size());
  for (const auto &testarrayoftables_ : o.testarrayoftables) { testarrayoftables.emplace_back((testarrayoftables_) ? new MyGame::Example::MonsterT(*testarrayoftables_) : nullptr); }
  vector_of_referrables.reserve(o.vector_of_referrables.size());
  for (const auto &vector_of_referrables_ : o.vector_of_referrables) { vector_of_referrables.emplace_back((vector_of_referrables_) ? new MyGame::Example::ReferrableT(*vector_of_referrables_) : nullptr); }
  vector_of_strong_referrables.reserve(o.vector_of_strong_referrables.size());
  for (const auto &vector_of_strong_referrables_ : o.vector_of_strong_referrables) { vector_of_strong_referrables.emplace_back((vector_of_strong_referrables_) ? new MyGame::Example::ReferrableT(*vector_of_strong_referrables_) : nullptr); }
  vector_of_co_owning_references.reserve(o.vector_of_co_owning_references.size());
  for (const auto &vector_of_co_owning_references_ : o.vector_of_co_owning_references) { vector_of_co_owning_references.emplace_back((vector_of_co_owning_references_) ? new ReferrableT(*vector_of_co_owning_references_) : nullptr); }
  scalar_key_sorted_tables.reserve(o.scalar_key_sorted_tables.size());
  for (const auto &scalar_key_sorted_tables_ : o.scalar_key_sorted_tables) { scalar_key_sorted_tables.emplace_back((scalar_key_sorted_tables_) ? new MyGame::Example::StatT(*scalar_key_sorted_tables_) : nullptr); }
}